

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O0

void sptk::snack::get_fast_cands
               (float *fdata,float *fdsdata,int ind,int step,int size,int dec,int start,int nlags,
               float *engref,int *maxloc,float *maxval,Cross *cp,float *peaks,int *locs,int *ncand,
               F0_params *par,int *dbsize,float **dbdata)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_R8D;
  int in_R9D;
  float fVar5;
  double dVar6;
  int in_stack_00000008;
  int in_stack_00000010;
  float *in_stack_00000018;
  undefined4 *in_stack_00000020;
  float *in_stack_00000028;
  Cross *in_stack_00000030;
  float *in_stack_00000038;
  int *in_stack_00000040;
  int lim_1;
  int inner_1;
  int outer_1;
  float *pem_1;
  float *pe_1;
  float smaxval_1;
  int lt_1;
  int *locm_1;
  int *loc_1;
  int lim;
  int inner;
  int outer;
  float *pem;
  float smaxval;
  int lt;
  int *locm;
  int *loc;
  float *pe;
  float lag_wt;
  float yp;
  float xp;
  float *corp;
  int *lp;
  int j;
  int i;
  int decsize;
  int decnlags;
  int decstart;
  int decind;
  float **dbdatap;
  int local_e0;
  int local_dc;
  float *local_d8;
  float *local_d0;
  int *local_c0;
  int *local_b8;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int iVar7;
  int in_stack_ffffffffffffff5c;
  float *in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float *in_stack_ffffffffffffff70;
  float *local_88;
  float *in_stack_ffffffffffffff80;
  float *maxloc_00;
  undefined4 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  float **locs_00;
  int *piVar8;
  int in_stack_ffffffffffffffa8;
  int local_48;
  
  fVar5 = pem_1[1] / (float)in_stack_00000010;
  iVar2 = in_stack_00000010 / in_R9D + 1;
  local_48 = in_stack_00000008 / in_R9D;
  if (local_48 < 1) {
    local_48 = 1;
  }
  iVar3 = in_R8D / in_R9D + 1;
  dbdatap = (float **)in_stack_00000030->correl;
  locs_00 = dbdatap;
  crossf(in_stack_ffffffffffffff70,(int)in_stack_ffffffffffffff6c,(int)in_stack_ffffffffffffff68,
         (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
         (float *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
         (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
         in_stack_ffffffffffffff80,(float *)CONCAT44(fVar5,in_stack_ffffffffffffff88),
         (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),dbdatap);
  in_stack_00000030->maxloc = (short)*in_stack_00000020;
  in_stack_00000030->maxval = *in_stack_00000028;
  dVar6 = std::sqrt((double)(ulong)(uint)(*in_stack_00000018 / (float)in_R8D));
  in_stack_00000030->rms = SUB84(dVar6,0);
  in_stack_00000030->firstlag = (short)local_48;
  get_cand(in_stack_00000030,in_stack_00000038,in_stack_00000040,iVar2,_inner_1,*pem_1);
  maxloc_00 = in_stack_00000038;
  piVar8 = in_stack_00000040;
  iVar7 = *_inner_1;
  while (iVar4 = iVar7 + -1, iVar7 != 0) {
    in_stack_ffffffffffffffa8 = (*piVar8 - local_48) + -1;
    peak(_smaxval_1,pe_1,(float *)dbdatap);
    *piVar8 = *piVar8 * in_R9D + (int)(in_stack_ffffffffffffff94 * (float)in_R9D + 0.5);
    *maxloc_00 = in_stack_ffffffffffffff90 * (-fVar5 * (float)*piVar8 + 1.0);
    maxloc_00 = maxloc_00 + 1;
    piVar8 = piVar8 + 1;
    iVar7 = iVar4;
  }
  if ((int)pem_1[0xe] <= *_inner_1) {
    fVar1 = pem_1[0xe];
    for (in_stack_ffffffffffffff5c = 0; in_stack_ffffffffffffff5c < (int)fVar1 + -1;
        in_stack_ffffffffffffff5c = in_stack_ffffffffffffff5c + 1) {
      maxloc_00 = in_stack_00000038 + *_inner_1;
      in_stack_ffffffffffffff60 = maxloc_00 + -2;
      local_88 = (float *)(in_stack_00000040 + *_inner_1);
      in_stack_ffffffffffffff70 = local_88 + -2;
      iVar7 = (*_inner_1 + -1) - in_stack_ffffffffffffff5c;
      while (maxloc_00 = maxloc_00 + -1, local_88 = local_88 + -1,
            in_stack_ffffffffffffff58 = iVar7 + -1, iVar7 != 0) {
        in_stack_ffffffffffffff68 = *maxloc_00;
        if (*in_stack_ffffffffffffff60 <= in_stack_ffffffffffffff68 &&
            in_stack_ffffffffffffff68 != *in_stack_ffffffffffffff60) {
          *maxloc_00 = *in_stack_ffffffffffffff60;
          *in_stack_ffffffffffffff60 = in_stack_ffffffffffffff68;
          in_stack_ffffffffffffff6c = *local_88;
          *local_88 = *in_stack_ffffffffffffff70;
          *in_stack_ffffffffffffff70 = in_stack_ffffffffffffff6c;
        }
        in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 + -1;
        in_stack_ffffffffffffff70 = in_stack_ffffffffffffff70 + -1;
        iVar7 = in_stack_ffffffffffffff58;
      }
    }
    *_inner_1 = (int)pem_1[0xe] + -1;
  }
  crossfi(in_stack_ffffffffffffff70,(int)in_stack_ffffffffffffff6c,(int)in_stack_ffffffffffffff68,
          (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(int)in_stack_ffffffffffffff60,
          (float *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(int *)maxloc_00,
          (float *)CONCAT44(fVar5,in_stack_ffffffffffffff88),
          (float *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(int *)locs_00,
          (int)piVar8,(int *)CONCAT44(iVar4,in_stack_ffffffffffffffa8),
          (float **)CONCAT44(iVar2,iVar3));
  in_stack_00000030->maxloc = (short)*in_stack_00000020;
  in_stack_00000030->maxval = *in_stack_00000028;
  dVar6 = std::sqrt((double)(ulong)(uint)(*in_stack_00000018 / (float)in_R8D));
  in_stack_00000030->rms = SUB84(dVar6,0);
  in_stack_00000030->firstlag = (short)in_stack_00000008;
  get_cand(in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000010,_inner_1,*pem_1);
  if ((int)pem_1[0xe] <= *_inner_1) {
    local_dc = 0;
    fVar5 = pem_1[0xe];
    for (; local_dc < (int)fVar5 + -1; local_dc = local_dc + 1) {
      local_d0 = in_stack_00000038 + *_inner_1;
      local_d8 = local_d0 + -2;
      local_b8 = in_stack_00000040 + *_inner_1;
      local_c0 = local_b8 + -2;
      local_e0 = (*_inner_1 + -1) - local_dc;
      while (local_b8 = local_b8 + -1, local_d0 = local_d0 + -1, local_e0 != 0) {
        fVar1 = *local_d0;
        if (*local_d8 <= fVar1 && fVar1 != *local_d8) {
          *local_d0 = *local_d8;
          *local_d8 = fVar1;
          iVar2 = *local_b8;
          *local_b8 = *local_c0;
          *local_c0 = iVar2;
        }
        local_d8 = local_d8 + -1;
        local_c0 = local_c0 + -1;
        local_e0 = local_e0 + -1;
      }
    }
    *_inner_1 = (int)pem_1[0xe] + -1;
  }
  return;
}

Assistant:

void get_fast_cands(float *fdata, float *fdsdata, int ind, int step, int size,
                    int dec, int start, int nlags, float *engref, int *maxloc,
                    float *maxval, Cross *cp, float *peaks, int *locs,
                    int *ncand, F0_params *par, int *dbsize, float **dbdata)
#endif
{
  int decind, decstart, decnlags, decsize, i, j, *lp;
  float *corp, xp, yp, lag_wt;
  register float *pe;

  lag_wt = par->lag_weight/nlags;
  decnlags = 1 + (nlags/dec);
  if((decstart = start/dec) < 1) decstart = 1;
  decind = (ind * step)/dec;
  decsize = 1 + (size/dec);
  corp = cp->correl;
    
  crossf(fdsdata + decind, decsize, decstart, decnlags, engref, maxloc,
#if 0
	maxval, corp);
#else
	maxval, corp, dbsize, dbdata);
#endif
  cp->maxloc = *maxloc;	/* location of maximum in correlation */
  cp->maxval = *maxval;	/* max. correlation value (found at maxloc) */
  cp->rms = (float) sqrt(*engref/size); /* rms in reference window */
  cp->firstlag = decstart;

  get_cand(cp,peaks,locs,decnlags,ncand,par->cand_thresh); /* return high peaks in xcorr */

  /* Interpolate to estimate peak locations and values at high sample rate. */
  for(i = *ncand, lp = locs, pe = peaks; i--; pe++, lp++) {
    j = *lp - decstart - 1;
    peak(&corp[j],&xp,&yp);
    *lp = (*lp * dec) + (int)(0.5+(xp*dec)); /* refined lag */
    *pe = yp*(1.0f - (lag_wt* *lp)); /* refined amplitude */
  }
  
  if(*ncand >= par->n_cands) {	/* need to prune candidates? */
    register int *loc, *locm, lt;
    register float smaxval, *pem;
    register int outer, inner, lim;
    for(outer=0, lim = par->n_cands-1; outer < lim; outer++)
      for(inner = *ncand - 1 - outer,
	  pe = peaks + (*ncand) -1, pem = pe-1,
	  loc = locs + (*ncand) - 1, locm = loc-1;
	  inner--;
	  pe--,pem--,loc--,locm--)
	if((smaxval = *pe) > *pem) {
	  *pe = *pem;
	  *pem = smaxval;
	  lt = *loc;
	  *loc = *locm;
	  *locm = lt;
	}
    *ncand = par->n_cands-1;  /* leave room for the unvoiced hypothesis */
  }
  crossfi(fdata + (ind * step), size, start, nlags, 7, engref, maxloc,
#if 0
	  maxval, corp, locs, *ncand);
#else
	  maxval, corp, locs, *ncand, dbsize, dbdata);
#endif

  cp->maxloc = *maxloc;	/* location of maximum in correlation */
  cp->maxval = *maxval;	/* max. correlation value (found at maxloc) */
  cp->rms = (float) sqrt(*engref/size); /* rms in reference window */
  cp->firstlag = start;
  get_cand(cp,peaks,locs,nlags,ncand,par->cand_thresh); /* return high peaks in xcorr */
    if(*ncand >= par->n_cands) {	/* need to prune candidates again? */
    register int *loc, *locm, lt;
    register float smaxval, *pe, *pem;
    register int outer, inner, lim;
    for(outer=0, lim = par->n_cands-1; outer < lim; outer++)
      for(inner = *ncand - 1 - outer,
	  pe = peaks + (*ncand) -1, pem = pe-1,
	  loc = locs + (*ncand) - 1, locm = loc-1;
	  inner--;
	  pe--,pem--,loc--,locm--)
	if((smaxval = *pe) > *pem) {
	  *pe = *pem;
	  *pem = smaxval;
	  lt = *loc;
	  *loc = *locm;
	  *locm = lt;
	}
    *ncand = par->n_cands - 1;  /* leave room for the unvoiced hypothesis */
  }
}